

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate __thiscall QDate::addMonths(QDate *this,int nmonths,QCalendar cal)

{
  QDate date;
  bool bVar1;
  int iVar2;
  int in_ESI;
  QCalendar in_RDI;
  long in_FS_OFFSET;
  YearMonthDay YVar3;
  int count;
  YearMonthDay parts;
  QDate *in_stack_ffffffffffffff70;
  int local_84;
  int local_78;
  QCalendarBackend *this_00;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  YearMonthDay local_40 [2];
  undefined8 local_28;
  int local_20;
  QCalendarBackend *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI.d_ptr;
  bVar1 = isValid((QDate *)in_RDI.d_ptr);
  if (bVar1) {
    if (in_ESI == 0) {
      local_10 = (QCalendarBackend *)(in_RDI.d_ptr)->_vptr_QCalendarBackend;
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = -0x55555556;
      date.jd._4_4_ = in_stack_ffffffffffffffbc;
      date.jd._0_4_ = in_stack_ffffffffffffffb8;
      YVar3 = QCalendar::partsFromDate((QCalendar *)this_00,date);
      local_40[0]._0_8_ = YVar3._0_8_;
      local_28._0_4_ = local_40[0].year;
      local_28._4_4_ = local_40[0].month;
      local_40[0].day = YVar3.day;
      local_20 = local_40[0].day;
      bVar1 = QCalendar::YearMonthDay::isValid((YearMonthDay *)&local_28);
      if (bVar1) {
        local_28._4_4_ = in_ESI + local_28._4_4_;
        while (local_28._4_4_ < 1) {
          local_28._0_4_ = (int)local_28 + -1;
          if (((int)local_28 != 0) ||
             (bVar1 = QCalendar::hasYearZero((QCalendar *)in_RDI.d_ptr), bVar1)) {
            iVar2 = QCalendar::monthsInYear((QCalendar *)this_00,in_ESI);
            local_28._4_4_ = iVar2 + local_28._4_4_;
          }
        }
        local_78 = QCalendar::monthsInYear((QCalendar *)this_00,in_ESI);
        while( true ) {
          if (local_28._4_4_ <= local_78) break;
          local_28._0_4_ = (int)local_28 + 1;
          local_28._4_4_ = local_28._4_4_ - local_78;
          if (((int)local_28 != 0) ||
             (bVar1 = QCalendar::hasYearZero((QCalendar *)in_RDI.d_ptr), bVar1)) {
            local_84 = QCalendar::monthsInYear((QCalendar *)this_00,in_ESI);
          }
          else {
            local_84 = 0;
          }
          local_78 = local_84;
        }
        YVar3.month = local_20;
        YVar3.year = local_28._4_4_;
        YVar3.day = in_stack_ffffffffffffffa4;
        local_10 = (QCalendarBackend *)fixedDate(YVar3,in_RDI);
      }
      else {
        QDate(in_stack_ffffffffffffff70);
      }
    }
  }
  else {
    QDate(in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDate)(qint64)local_10;
}

Assistant:

QDate QDate::addMonths(int nmonths, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = cal.partsFromDate(*this);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year || cal.hasYearZero());

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year || cal.hasYearZero())
            parts.month += cal.monthsInYear(parts.year);
    }
    int count = cal.monthsInYear(parts.year);
    while (parts.month > count) {
        parts.month -= count;
        count = (++parts.year || cal.hasYearZero()) ? cal.monthsInYear(parts.year) : 0;
    }

    return fixedDate(parts, cal);
}